

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::put_back
          (input_stream_t<cfgfile::string_trait_t> *this,char_t ch)

{
  pos_t pVar1;
  bool bVar2;
  reference pvVar3;
  value_type *in_RDI;
  value_type prev;
  stack<char,_std::deque<char,_std::allocator<char>_>_> *this_00;
  
  bVar2 = std::
          stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
          ::empty((stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
                   *)0x138072);
  if (!bVar2) {
    pvVar3 = std::
             stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
             ::top((stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
                    *)0x138083);
    this_00 = (stack<char,_std::deque<char,_std::allocator<char>_>_> *)pvVar3->m_column_number;
    pVar1 = pvVar3->m_line_number;
    std::
    stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
    ::pop((stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
           *)0x1380a1);
    *(stack<char,_std::deque<char,_std::allocator<char>_>_> **)(in_RDI + 0x10) = this_00;
    *(pos_t *)(in_RDI + 8) = pVar1;
    std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push(this_00,in_RDI);
  }
  return;
}

Assistant:

void put_back( typename Trait::char_t ch )
	{
		if( !m_prev_positions.empty() )
		{
			const auto prev = m_prev_positions.top();
			m_prev_positions.pop();

			m_column_number = prev.m_column_number;
			m_line_number = prev.m_line_number;

			m_returned_char.push( ch );
		}
	}